

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fImplementationLimitTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles3::Functional::LimitQueryCase<deqp::gles3::Functional::LimitQuery::Boolean>::iterate
          (LimitQueryCase<deqp::gles3::Functional::LimitQuery::Boolean> *this)

{
  ostringstream *poVar1;
  char *pcVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  deUint32 err;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar6;
  bool bVar7;
  bool bVar8;
  GLboolean val;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_1b0._0_8_ = local_1b0._0_8_ & 0xffffffffffffff00;
  (**(code **)(CONCAT44(extraout_var_00,iVar5) + 0x798))(this->m_limit,local_1b0);
  cVar3 = local_1b0[0];
  err = (**(code **)(CONCAT44(extraout_var,iVar4) + 0x800))();
  glu::checkError(err,"Query failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fImplementationLimitTests.cpp"
                  ,0xf4);
  bVar7 = (this->m_minRequiredValue).value != '\0';
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Reported: ",10);
  pcVar2 = "mapped_ == GL_TRUE";
  pcVar6 = "mapped_ == GL_TRUE";
  if (cVar3 == '\0') {
    pcVar6 = "mapped_ == GL_FALSE";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,pcVar6 + 0xb,(ulong)(cVar3 == '\0') + 7);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Minimum required: ",0x12);
  bVar8 = (this->m_minRequiredValue).value == '\0';
  if (bVar8) {
    pcVar2 = "mapped_ == GL_FALSE";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,pcVar2 + 0xb,(ulong)bVar8 + 7);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  if (bVar7 && cVar3 == '\0') {
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"FAIL: ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"reported value is less than minimum required value!",0x33);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    pcVar6 = "Requirement not satisfied";
  }
  else {
    pcVar6 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
             (uint)(bVar7 && cVar3 == '\0'),pcVar6);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		const glw::Functions&	gl		= m_context.getRenderContext().getFunctions();
		const T					value	= query<T>(m_context.getRenderContext().getFunctions(), m_limit);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Query failed");

		const bool isOk = compare<T>(m_minRequiredValue, value);

		m_testCtx.getLog() << TestLog::Message << "Reported: " << value << TestLog::EndMessage;
		m_testCtx.getLog() << TestLog::Message << "Minimum required: " << m_minRequiredValue << TestLog::EndMessage;

		if (!isOk)
			m_testCtx.getLog() << TestLog::Message << "FAIL: " << QueryClassTraits<(QueryClass)QueryTypeTraits<T>::CLASS>::s_errorDescription << TestLog::EndMessage;

		m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
								isOk ? "Pass"				: "Requirement not satisfied");
		return STOP;
	}